

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::anon_unknown_2::LineWidthCase::test(LineWidthCase *this)

{
  CallLogWrapper *this_00;
  GLfloat GVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  GLfloat range [2];
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  range[0] = 1.0;
  range[1] = 0.0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetFloatv(this_00,0x846e,range);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar2 = 0x78;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    GVar1 = range[0];
    fVar5 = range[1] - range[0];
    fVar4 = deRandom_getFloat(&rnd.m_rnd);
    fVar4 = fVar4 * fVar5 + GVar1;
    glu::CallLogWrapper::glLineWidth(this_00,fVar4);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar4,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLfloat range[2] = {1};
		glGetFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);
		expectError(GL_NO_ERROR);

		m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, 1.0f);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(range[0], range[1]);

			glLineWidth(reference);
			m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, reference);
			expectError(GL_NO_ERROR);
		}
	}